

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O2

Fraig_Man_t * Fraig_ManCreate(Fraig_Params_t *pParams)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  Fraig_Man_t *p;
  Fraig_MemFixed_t *pFVar4;
  Fraig_NodeVec_t *pFVar5;
  Fraig_HashTable_t *pFVar6;
  Fraig_Node_t *pFVar7;
  Msat_IntVec_t *pMVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int *piVar14;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  ABC_INT64_T *local_88;
  int local_80 [2];
  int local_78 [2];
  int local_70 [2];
  int local_68 [2];
  int local_60 [4];
  int local_50 [6];
  ABC_INT64_T local_38;
  
  Aig_ManRandom(1);
  if (pParams == (Fraig_Params_t *)0x0) {
    piVar3 = local_50 + 5;
    local_50[5] = 0x800;
    local_c8 = local_60;
    local_60[0] = 99;
    local_c0 = local_50 + 4;
    local_50[4] = 0x14;
    piVar9 = local_68;
    local_68[0] = 1;
    local_b8 = local_50 + 3;
    local_50[3] = 1;
    local_b0 = local_70;
    local_a8 = local_50 + 2;
    local_50[2] = 0;
    local_a0 = local_78;
    local_78[0] = 0;
    local_98 = local_80;
    local_80[0] = 0;
    local_90 = local_50;
    local_50[0] = 0;
    local_88 = &local_38;
    local_38 = 0;
    piVar14 = local_50 + 1;
    local_50[1] = 1;
    uVar10 = 0x800;
    pParams = (Fraig_Params_t *)(local_60 + 2);
    local_70[0] = 1;
  }
  else {
    piVar3 = &pParams->nPatsDyna;
    local_88 = &pParams->nInspLimit;
    local_90 = &pParams->fVerboseP;
    local_98 = &pParams->fVerbose;
    piVar14 = &pParams->fTryProve;
    local_a0 = &pParams->fChoicing;
    local_a8 = &pParams->fDoSparse;
    local_b0 = &pParams->fDist1Pats;
    local_b8 = &pParams->fFeedBack;
    piVar9 = &pParams->fFuncRed;
    local_c0 = &pParams->nSeconds;
    local_c8 = &pParams->nBTLimit;
    uVar10 = pParams->nPatsRand;
    if ((int)uVar10 < 0x80) {
      pParams->nPatsRand = 0x80;
      uVar10 = 0x80;
    }
    else if (0x8000 < uVar10) {
      pParams->nPatsRand = 0x8000;
      uVar10 = 0x8000;
    }
  }
  uVar12 = *piVar3;
  uVar2 = 0x80;
  if (((int)uVar12 < 0x80) || (uVar2 = 0x8000, 0x8000 < uVar12)) {
    uVar12 = uVar2;
    *piVar3 = uVar12;
  }
  iVar1 = *piVar9;
  if (iVar1 == 0) {
    uVar12 = 0x80;
    *piVar3 = 0x80;
    pParams->nPatsRand = 0x80;
    uVar10 = 0x80;
  }
  p = (Fraig_Man_t *)calloc(1,0x1d0);
  iVar13 = ((uVar10 >> 5) + 1) - (uint)((uVar10 & 0x1f) == 0);
  p->nWordsRand = iVar13;
  iVar11 = ((uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0);
  p->nWordsDyna = iVar11;
  p->nBTLimit = *local_c8;
  p->nSeconds = *local_c0;
  p->fFuncRed = iVar1;
  p->fFeedBack = *local_b8;
  p->fDist1Pats = *local_b0;
  p->fDoSparse = *local_a8;
  p->fChoicing = *local_a0;
  p->fTryProve = *piVar14;
  p->fVerbose = *local_98;
  p->fVerboseP = *local_90;
  p->nInspLimit = *local_88;
  pFVar4 = Fraig_MemFixedStart(0xa0);
  p->mmNodes = pFVar4;
  pFVar4 = Fraig_MemFixedStart((iVar11 + iVar13) * 4);
  p->mmSims = pFVar4;
  pFVar5 = Fraig_NodeVecAlloc(1000);
  p->vInputs = pFVar5;
  pFVar5 = Fraig_NodeVecAlloc(1000);
  p->vOutputs = pFVar5;
  pFVar5 = Fraig_NodeVecAlloc(1000);
  p->vNodes = pFVar5;
  pFVar6 = Fraig_HashTableCreate(1000);
  p->pTableS = pFVar6;
  pFVar6 = Fraig_HashTableCreate(1000);
  p->pTableF = pFVar6;
  pFVar6 = Fraig_HashTableCreate(1000);
  p->pTableF0 = pFVar6;
  pFVar7 = Fraig_NodeCreateConst(p);
  p->pConst1 = pFVar7;
  Fraig_FeedBackInit(p);
  pMVar8 = Msat_IntVecAlloc(10);
  p->vProj = pMVar8;
  p->nTravIds = 1;
  p->nTravIds2 = 1;
  return p;
}

Assistant:

Fraig_Man_t * Fraig_ManCreate( Fraig_Params_t * pParams )
{
    Fraig_Params_t Params;
    Fraig_Man_t * p;

    // set the random seed for simulation
//    srand( 0xFEEDDEAF );
//    srand( 0xDEADCAFE );
    Aig_ManRandom( 1 );

    // set parameters for equivalence checking
    if ( pParams == NULL )
        Fraig_ParamsSetDefault( pParams = &Params );
    // adjust the amount of simulation info
    if ( pParams->nPatsRand < 128 )
        pParams->nPatsRand = 128;
    if ( pParams->nPatsRand > 32768 )
        pParams->nPatsRand = 32768;
    if ( pParams->nPatsDyna < 128 )
        pParams->nPatsDyna = 128;
    if ( pParams->nPatsDyna > 32768 )
        pParams->nPatsDyna = 32768;
    // if reduction is not performed, allocate minimum simulation info
    if ( !pParams->fFuncRed )
        pParams->nPatsRand = pParams->nPatsDyna = 128;

    // start the manager
    p = ABC_ALLOC( Fraig_Man_t, 1 );
    memset( p, 0, sizeof(Fraig_Man_t) );

    // set the default parameters
    p->nWordsRand = FRAIG_NUM_WORDS( pParams->nPatsRand );  // the number of words of random simulation info
    p->nWordsDyna = FRAIG_NUM_WORDS( pParams->nPatsDyna );  // the number of patterns for dynamic simulation info
    p->nBTLimit   = pParams->nBTLimit;    // -1 means infinite backtrack limit
    p->nSeconds   = pParams->nSeconds;    // the timeout for the final miter
    p->fFuncRed   = pParams->fFuncRed;    // enables functional reduction (otherwise, only one-level hashing is performed)
    p->fFeedBack  = pParams->fFeedBack;   // enables solver feedback (the use of counter-examples in simulation)
    p->fDist1Pats = pParams->fDist1Pats;  // enables solver feedback (the use of counter-examples in simulation)
    p->fDoSparse  = pParams->fDoSparse;   // performs equivalence checking for sparse functions (whose sim-info is 0)
    p->fChoicing  = pParams->fChoicing;   // disable accumulation of structural choices (keeps only the first choice)
    p->fTryProve  = pParams->fTryProve;   // disable accumulation of structural choices (keeps only the first choice)
    p->fVerbose   = pParams->fVerbose;    // disable verbose output
    p->fVerboseP  = pParams->fVerboseP;   // disable verbose output
    p->nInspLimit = pParams->nInspLimit;  // the limit on the number of inspections

    // start memory managers
    p->mmNodes    = Fraig_MemFixedStart( sizeof(Fraig_Node_t) );
    p->mmSims     = Fraig_MemFixedStart( sizeof(unsigned) * (p->nWordsRand + p->nWordsDyna) );
    // allocate node arrays
    p->vInputs    = Fraig_NodeVecAlloc( 1000 );    // the array of primary inputs
    p->vOutputs   = Fraig_NodeVecAlloc( 1000 );    // the array of primary outputs
    p->vNodes     = Fraig_NodeVecAlloc( 1000 );    // the array of internal nodes
    // start the tables
    p->pTableS    = Fraig_HashTableCreate( 1000 ); // hashing by structure
    p->pTableF    = Fraig_HashTableCreate( 1000 ); // hashing by function
    p->pTableF0   = Fraig_HashTableCreate( 1000 ); // hashing by function (for sparse functions)
    // create the constant node
    p->pConst1    = Fraig_NodeCreateConst( p );
    // initialize SAT solver feedback data structures
    Fraig_FeedBackInit( p );
    // initialize other variables
    p->vProj      = Msat_IntVecAlloc( 10 ); 
    p->nTravIds   = 1;
    p->nTravIds2  = 1;
    return p;
}